

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<-14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<-5>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<_14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<_5>,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  sVar3 = this->index_;
  uVar1 = sVar3 + 0x12;
  if (uVar1 < 0x26) {
    uVar5 = sVar3 - 1;
    if (uVar1 < 0x13) {
      uVar5 = uVar1;
    }
    uVar1 = sVar3 + 0x11;
    if (uVar1 < 0x26) {
      uVar8 = sVar3 - 2;
      if (uVar1 < 0x13) {
        uVar8 = uVar1;
      }
      uVar1 = sVar3 + 0x10;
      if (uVar1 < 0x26) {
        uVar6 = sVar3 + 0xf;
        uVar10 = sVar3 - 3;
        if (uVar1 < 0x13) {
          uVar10 = uVar1;
        }
        if ((uVar6 < 0x26) && (uVar1 = sVar3 + 0xe, uVar1 < 0x26)) {
          uVar4 = this->state_[uVar5];
          uVar2 = this->state_[uVar8];
          uVar8 = sVar3 - 4;
          if (uVar6 < 0x13) {
            uVar8 = uVar6;
          }
          uVar9 = this->state_[uVar10] >> 0xb ^
                  this->state_[sVar3] >> 0x13 ^ this->state_[sVar3] ^ this->state_[uVar10];
          uVar6 = sVar3 - 5;
          if (uVar1 < 0x13) {
            uVar6 = uVar1;
          }
          uVar7 = this->state_[uVar8] ^ uVar9 ^ this->state_[uVar8] << 0xe ^ this->state_[uVar6];
          this->state_[sVar3] = uVar7;
          uVar4 = uVar4 >> 0x12 ^ (uVar2 & 1 | uVar4 & 0xfffffffe) ^ uVar9 ^ uVar7 ^ uVar7 << 5;
          this->state_[uVar5] = uVar4;
          this->index_ = uVar5;
          return uVar4;
        }
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 19>::calc(T, std::false_type) [UIntType = unsigned long, r = 19, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }